

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

int __thiscall GGWave::init(GGWave *this,EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Protocol *pPVar5;
  int16_t iVar6;
  int8_t iVar7;
  int8_t iVar8;
  int8_t iVar9;
  bool bVar10;
  undefined2 uVar11;
  uint in_ECX;
  ulong uVar12;
  long in_RDX;
  ulong uVar13;
  int iVar14;
  ulong unaff_RBP;
  ulong uVar15;
  uchar uVar16;
  char *__format;
  uint in_R8D;
  
  iVar14 = (int)ctx;
  uVar12 = (ulong)ctx & 0xffffffff;
  if (iVar14 < 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      __format = "Negative data size: %d\n";
      uVar13 = uVar12;
      goto LAB_00105048;
    }
  }
  else {
    if (this->m_isTxEnabled != true) {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0 && iVar14 != 0) {
        fwrite("Tx is disabled - cannot transmit data with this GGWave instance\n",0x40,1,
               (anonymous_namespace)::g_fptr);
      }
LAB_001050f8:
      iVar14 = (int)CONCAT71((int7)(unaff_RBP >> 8),1);
      if (this->m_isRxEnabled != true) {
        return iVar14;
      }
      (this->m_rx).receiving = false;
      (this->m_rx).analyzing = false;
      (this->m_rx).framesLeftToAnalyze = 0;
      (this->m_rx).framesLeftToRecord = 0;
      (this->m_rx).framesToAnalyze = 0;
      (this->m_rx).framesToRecord = 0;
      memset((this->m_rx).spectrum.m_data,0,(long)(this->m_rx).spectrum.m_size << 2);
      memset((this->m_rx).amplitude.m_data,0,(long)(this->m_rx).amplitude.m_size << 2);
      iVar3 = (this->m_rx).amplitudeHistory.m_size0;
      if ((0 < iVar3) && (iVar4 = (this->m_rx).amplitudeHistory.m_size1, 0 < iVar4)) {
        memset((this->m_rx).amplitudeHistory.m_data,0,(ulong)(uint)(iVar4 * iVar3) << 2);
      }
      memset((this->m_rx).data.m_data,0,(long)(this->m_rx).data.m_size);
      iVar3 = (this->m_rx).spectrumHistoryFixed.m_size0;
      if (iVar3 < 1) {
        return iVar14;
      }
      iVar4 = (this->m_rx).spectrumHistoryFixed.m_size1;
      if (iVar4 < 1) {
        return iVar14;
      }
      memset((this->m_rx).spectrumHistoryFixed.m_data,0,(ulong)(uint)(iVar4 * iVar3));
      return iVar14;
    }
    uVar13 = (ulong)in_ECX;
    uVar15 = 0x8c;
    if (this->m_isFixedPayloadLength != false) {
      uVar15 = (ulong)(uint)this->m_payloadLength;
    }
    unaff_RBP = uVar12;
    if (((int)uVar15 < iVar14) && (unaff_RBP = uVar15, (anonymous_namespace)::g_fptr != (FILE *)0x0)
       ) {
      fprintf((anonymous_namespace)::g_fptr,"Truncating data from %d to %d bytes\n",uVar12,uVar15);
    }
    if (in_R8D < 0x65) {
      (this->m_tx).hasData = false;
      memset((this->m_tx).data.m_data,0,(long)(this->m_tx).data.m_size);
      memset((this->m_dataEncoded).m_data,0,(long)(this->m_dataEncoded).m_size);
      iVar14 = (int)unaff_RBP;
      if (iVar14 < 1) goto LAB_001050f8;
      if (in_ECX < 0x16) {
        if ((this->m_tx).protocols.data[in_ECX].enabled == false) {
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            __format = 
            "Protocol %d is not enabled - make sure to enable it before creating the instance\n";
            goto LAB_00105048;
          }
        }
        else {
          bVar2 = this->m_isFixedPayloadLength;
          if ((this->m_tx).protocols.data[in_ECX].extra != '\x02' || bVar2 != false) {
            pPVar5 = (this->m_tx).protocols.data + in_ECX;
            iVar6 = pPVar5->freqStart;
            iVar7 = pPVar5->framesPerTx;
            iVar8 = pPVar5->bytesPerTx;
            iVar9 = pPVar5->extra;
            bVar10 = pPVar5->enabled;
            uVar11 = *(undefined2 *)&pPVar5->field_0xe;
            (this->m_tx).protocol.name = (this->m_tx).protocols.data[in_ECX].name;
            (this->m_tx).protocol.freqStart = iVar6;
            (this->m_tx).protocol.framesPerTx = iVar7;
            (this->m_tx).protocol.bytesPerTx = iVar8;
            (this->m_tx).protocol.extra = iVar9;
            (this->m_tx).protocol.enabled = bVar10;
            *(undefined2 *)&(this->m_tx).protocol.field_0xe = uVar11;
            if ((bVar2 & 1U) != 0) {
              iVar14 = this->m_payloadLength;
            }
            (this->m_tx).dataLength = iVar14;
            (this->m_tx).sendVolume = (float)(int)in_R8D / 100.0;
            *(this->m_tx).data.m_data = (uchar)iVar14;
            if (0 < (this->m_tx).dataLength) {
              uVar12 = 0;
              do {
                if (uVar12 < unaff_RBP) {
                  uVar16 = *(uchar *)(in_RDX + uVar12);
                }
                else {
                  uVar16 = '\0';
                }
                (this->m_tx).data.m_data[uVar12 + 1] = uVar16;
                if (this->m_isDSSEnabled == true) {
                  pbVar1 = (this->m_tx).data.m_data + uVar12 + 1;
                  *pbVar1 = *pbVar1 ^ (anonymous_namespace)::kDSSMagic[(uint)uVar12 & 0x3f];
                }
                uVar12 = uVar12 + 1;
              } while ((long)uVar12 < (long)(this->m_tx).dataLength);
            }
            (this->m_tx).hasData = true;
            goto LAB_001050f8;
          }
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            fwrite("Mono-tone protocols with variable length are not supported\n",0x3b,1,
                   (anonymous_namespace)::g_fptr);
          }
        }
      }
      else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        __format = "Invalid protocol ID: %d\n";
LAB_00105048:
        fprintf((anonymous_namespace)::g_fptr,__format,uVar13);
        return 0;
      }
    }
    else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      __format = "Invalid volume: %d\n";
      uVar13 = (ulong)in_R8D;
      goto LAB_00105048;
    }
  }
  return 0;
}

Assistant:

bool GGWave::init(int dataSize, const char * dataBuffer, TxProtocolId protocolId, const int volume) {
    if (dataSize < 0) {
        ggprintf("Negative data size: %d\n", dataSize);
        return false;
    }

    // Tx
    if (m_isTxEnabled) {
        const auto maxLength = m_isFixedPayloadLength ? m_payloadLength : kMaxLengthVariable;

        if (dataSize > maxLength) {
            ggprintf("Truncating data from %d to %d bytes\n", dataSize, maxLength);
            dataSize = maxLength;
        }

        if (volume < 0 || volume > 100) {
            ggprintf("Invalid volume: %d\n", volume);
            return false;
        }

        m_tx.hasData = false;
        m_tx.data.zero();
        m_dataEncoded.zero();

        if (dataSize > 0) {
            if (protocolId < 0 || protocolId >= m_tx.protocols.size()) {
                ggprintf("Invalid protocol ID: %d\n", protocolId);
                return false;
            }

            const auto & protocol = m_tx.protocols[protocolId];

            if (protocol.enabled == false) {
                ggprintf("Protocol %d is not enabled - make sure to enable it before creating the instance\n", protocolId);
                return false;
            }

            if (protocol.extra == 2 && m_isFixedPayloadLength == false) {
                ggprintf("Mono-tone protocols with variable length are not supported\n");
                return false;
            }

            m_tx.protocol   = protocol;
            m_tx.dataLength = m_isFixedPayloadLength ? m_payloadLength : dataSize;
            m_tx.sendVolume = ((double)(volume))/100.0f;

            m_tx.data[0] = m_tx.dataLength;
            for (int i = 0; i < m_tx.dataLength; ++i) {
                m_tx.data[i + 1] = i < dataSize ? dataBuffer[i] : 0;
                if (m_isDSSEnabled) {
                    m_tx.data[i + 1] ^= getDSSMagic(i);
                }
            }

            m_tx.hasData = true;
        }
    } else {
        if (dataSize > 0) {
            ggprintf("Tx is disabled - cannot transmit data with this GGWave instance\n");
        }
    }

    // Rx
    if (m_isRxEnabled) {
        m_rx.receiving = false;
        m_rx.analyzing = false;

        m_rx.framesToAnalyze = 0;
        m_rx.framesLeftToAnalyze = 0;
        m_rx.framesToRecord = 0;
        m_rx.framesLeftToRecord = 0;

        m_rx.spectrum.zero();
        m_rx.amplitude.zero();
        m_rx.amplitudeHistory.zero();

        m_rx.data.zero();

        m_rx.spectrumHistoryFixed.zero();
    }

    return true;
}